

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O2

void nivalis::anon_unknown_3::ast_sub_var(ASTNode **ast,uint64_t var_id,double value,AST *out)

{
  uint32_t opcode;
  pointer pAVar1;
  ASTNode *pAVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  
  opcode = (*ast)->opcode;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back(out,*ast);
  pAVar2 = *ast;
  if ((opcode == 2) && ((pAVar2->field_1).ref == var_id)) {
    pAVar1 = (out->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pAVar1[-1].opcode = 1;
    pAVar1[-1].field_1.val = value;
    pAVar2 = *ast;
  }
  *ast = pAVar2 + 1;
  uVar4 = 0;
  while( true ) {
    sVar3 = OpCode::n_args(opcode);
    if (sVar3 <= uVar4) break;
    ast_sub_var(ast,var_id,value,out);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void ast_sub_var(const Expr::ASTNode** ast, uint64_t var_id, double value, Expr::AST& out) {
    const auto* init_pos = ast;
    auto opcode = (*ast)->opcode;
    out.push_back(**ast);
    if (opcode == OpCode::ref &&
        (*ast)->ref == var_id) {
        out.back().opcode = OpCode::val;
        out.back().val = value;
    }

    ++*ast;
    for (size_t i = 0; i < OpCode::n_args(opcode); ++i) {
        ast_sub_var(ast, var_id, value, out);
    }
}